

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

uint16_t units::precise::custom::custom_count_unit_number(unit_data *UT)

{
  ushort uVar1;
  
  uVar1 = SUB42(*UT,2);
  return (uVar1 >> 10 & 4 | uVar1 >> 0xc & 2 | uVar1 >> 0xe & 1) +
         (ushort)(((uint)*UT & 0xc000) != 0) * 8;
}

Assistant:

constexpr bool has_e_flag() const { return e_flag_ != 0U; }